

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O2

void * aligned_malloc(size_t required_bytes,size_t alignment)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = (long)((int)alignment + 7);
  pvVar1 = malloc(required_bytes + lVar3);
  if (pvVar1 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(-alignment & lVar3 + (long)pvVar1);
    *(void **)((long)pvVar2 + -8) = pvVar1;
  }
  return pvVar2;
}

Assistant:

inline void *aligned_malloc(size_t required_bytes, size_t alignment) {
    void *p1;  // original block
    void **p2; // aligned block
    int offset = alignment - 1 + sizeof(void *);
    if ((p1 = (void *)malloc(required_bytes + offset)) == NULL) {
       return NULL;
    }
    p2 = (void **)(((size_t)(p1) + offset) & ~(alignment - 1));
    p2[-1] = p1;
    return p2;
}